

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O3

QSizeF __thiscall QEglFSKmsScreen::physicalSize(QEglFSKmsScreen *this)

{
  double dVar1;
  double dVar2;
  QSizeF QVar3;
  QSizeF QVar4;
  undefined1 auVar5 [16];
  
  dVar1 = (this->m_output).physical_size.wd;
  if ((0.0 < dVar1) && (dVar2 = (this->m_output).physical_size.ht, 0.0 < dVar2)) {
    QVar3.ht = dVar2;
    QVar3.wd = dVar1;
    return QVar3;
  }
  auVar5 = (**(code **)(*(long *)this + 0x20))();
  QVar4.wd = (double)((auVar5._8_4_ - auVar5._0_4_) + 1) * 0.254;
  QVar4.ht = (double)((auVar5._12_4_ - auVar5._4_4_) + 1) * 0.254;
  return QVar4;
}

Assistant:

constexpr inline bool QSizeF::isEmpty() const noexcept
{ return wd <= 0. || ht <= 0.; }